

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_get.c
# Opt level: O2

int mpt_config_get(mpt_config *conf,char *dest,mpt_type_t type,void *ptr)

{
  int iVar1;
  mpt_path path;
  
  path.len = 0;
  path.first = '\0';
  path.flags = '\0';
  path.sep = '.';
  path.assign = '\0';
  path._28_4_ = 0;
  path.base = (char *)0x0;
  path.off = 0;
  if (dest != (char *)0x0) {
    path.first = '\0';
    path.flags = '\0';
    path.sep = '.';
    path.assign = '\0';
    path._28_4_ = 0;
    mpt_path_set(&path,dest,-1);
  }
  iVar1 = mpt_config_getp(conf,&path,type,ptr);
  return iVar1;
}

Assistant:

extern int mpt_config_get(const MPT_INTERFACE(config) *conf, const char *dest, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(path) path = MPT_PATH_INIT;
	if (dest) {
		path.sep = '.';
		path.assign = 0;
		mpt_path_set(&path, dest, -1);
	}
	return mpt_config_getp(conf, &path, type, ptr);
}